

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1-format-cpdlc-json.c
# Opt level: O0

void la_asn1_format_FANSLongitude_as_json(la_asn1_formatter_params p)

{
  la_vstring *unaff_retaddr;
  char *ldir_name;
  long ldir;
  FANSLongitude_t *lat;
  char *in_stack_ffffffffffffffd8;
  la_vstring *vstr;
  asn_TYPE_descriptor_t *in_stack_ffffffffffffffe8;
  char *val;
  
  vstr = (la_vstring *)&stack0x00000008;
  val = (char *)lat->longitudeDirection;
  la_asn1_value2enum(in_stack_ffffffffffffffe8,(long)vstr);
  la_json_object_start(vstr,in_stack_ffffffffffffffd8);
  la_json_append_int64(vstr,in_stack_ffffffffffffffd8,0x17870b);
  if (lat->minutesLatLon != (FANSMinutesLatLon_t *)0x0) {
    la_json_append_double(vstr,in_stack_ffffffffffffffd8,7.61827981064431e-318);
  }
  la_json_append_string(unaff_retaddr,(char *)lat,val);
  la_json_object_end((la_vstring *)0x17876b);
  return;
}

Assistant:

static LA_ASN1_FORMATTER_FUNC(la_asn1_format_FANSLongitude_as_json) {
	FANSLongitude_t const *lat = p.sptr;
	long const ldir = lat->longitudeDirection;
	char const *ldir_name = la_asn1_value2enum(&asn_DEF_FANSLongitudeDirection, ldir);
	la_json_object_start(p.vstr, p.label);
	la_json_append_int64(p.vstr, "deg", lat->longitudeDegrees);
	if(lat->minutesLatLon != NULL) {
		la_json_append_double(p.vstr, "min", *(long const *)(lat->minutesLatLon) / 10.0);
	}
	la_json_append_string(p.vstr, "dir", ldir_name);
	la_json_object_end(p.vstr);
}